

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.h
# Opt level: O0

void __thiscall
slang::ast::ConstraintList::visitExprs<CollectLHSSymbols&>
          (ConstraintList *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  iterator this_00;
  iterator visitor_00;
  reference ppCVar2;
  Constraint *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Constraint_*const,_18446744073709551615UL> *__range3;
  span<const_slang::ast::Constraint_*const,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  Constraint *in_stack_ffffffffffffffd0;
  span<const_slang::ast::Constraint_*const,_18446744073709551615UL> *in_stack_ffffffffffffffd8;
  
  this_00 = std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>::begin
                      (in_stack_ffffffffffffffc8);
  visitor_00 = std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>::end
                         (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Constraint_*const_*,_std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Constraint_*const_*,_std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::Constraint_*const_*,_std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Constraint_*const_*,_std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<const_slang::ast::Constraint_*const_*,_std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffe0);
    in_stack_ffffffffffffffd0 = *ppCVar2;
    Constraint::visit<CollectLHSSymbols>
              ((Constraint *)this_00._M_current,(AlwaysFFVisitor *)visitor_00._M_current);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Constraint_*const_*,_std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::Constraint_*const_*,_std::span<const_slang::ast::Constraint_*const,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto item : list)
            item->visit(visitor);
    }